

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::ProjectionLight::Projection(ProjectionLight *this,Vector3f *wl,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Bounds2f BVar4;
  undefined1 auVar5 [12];
  RGB *pRVar6;
  int c;
  int c_00;
  undefined8 uVar7;
  Float FVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [56];
  undefined8 uVar15;
  undefined1 auVar16 [64];
  undefined1 auVar18 [56];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  SampledSpectrum SVar22;
  RGB rgb;
  RGB local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  SampledWavelengths *local_70;
  undefined1 local_68 [16];
  RGBSpectrum local_58;
  undefined1 auVar17 [64];
  
  fVar1 = (wl->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar15 = 0;
  if (fVar1 < this->hither) {
    return (array<float,_4>)ZEXT816(0);
  }
  BVar4 = this->screenBounds;
  fVar2 = (wl->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar3 = (wl->super_Tuple3<pbrt::Vector3,_float>).x;
  auVar21._4_4_ = fVar3;
  auVar21._0_4_ = fVar3;
  auVar21._8_4_ = fVar3;
  auVar21._12_4_ = fVar3;
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * (this->ScreenFromLight).m.m[3][1])),auVar21,
                            ZEXT416((uint)(this->ScreenFromLight).m.m[3][0]));
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar1),
                            ZEXT416((uint)(this->ScreenFromLight).m.m[3][2]));
  fVar3 = auVar19._0_4_ + (this->ScreenFromLight).m.m[3][3];
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->ScreenFromLight).m.m[0] + 1),
                          ZEXT416((uint)(this->ScreenFromLight).m.m[1][1]),0x10);
  auVar20._0_4_ = fVar2 * auVar19._0_4_;
  auVar20._4_4_ = fVar2 * auVar19._4_4_;
  auVar20._8_4_ = fVar2 * auVar19._8_4_;
  auVar20._12_4_ = fVar2 * auVar19._12_4_;
  auVar19 = vinsertps_avx((undefined1  [16])(this->ScreenFromLight).m.m[0],
                          ZEXT416((uint)(this->ScreenFromLight).m.m[1][0]),0x10);
  auVar20 = vfmadd213ps_fma(auVar19,auVar21,auVar20);
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->ScreenFromLight).m.m[0] + 2),
                          ZEXT416((uint)(this->ScreenFromLight).m.m[1][2]),0x10);
  auVar9._4_4_ = fVar1;
  auVar9._0_4_ = fVar1;
  auVar9._8_4_ = fVar1;
  auVar9._12_4_ = fVar1;
  auVar20 = vfmadd213ps_fma(auVar9,auVar19,auVar20);
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->ScreenFromLight).m.m[0] + 3),
                          ZEXT416((uint)(this->ScreenFromLight).m.m[1][3]),0x10);
  auVar10._0_4_ = auVar19._0_4_ + auVar20._0_4_;
  auVar10._4_4_ = auVar19._4_4_ + auVar20._4_4_;
  auVar10._8_4_ = auVar19._8_4_ + auVar20._8_4_;
  auVar10._12_4_ = auVar19._12_4_ + auVar20._12_4_;
  auVar19._4_4_ = fVar3;
  auVar19._0_4_ = fVar3;
  auVar19._8_4_ = fVar3;
  auVar19._12_4_ = fVar3;
  auVar19 = vdivps_avx(auVar10,auVar19);
  if ((fVar3 == 1.0) && (!NAN(fVar3))) {
    auVar19 = auVar10;
  }
  auVar11._8_8_ = auVar19._0_8_;
  auVar11._0_8_ = auVar19._0_8_;
  auVar13._0_8_ = vcmpps_avx512vl(auVar11,(undefined1  [16])BVar4,2);
  uVar7 = vcmpps_avx512vl((undefined1  [16])BVar4,auVar11,2);
  auVar20 = vpmovm2d_avx512vl(auVar13._0_8_);
  auVar9 = vpmovm2d_avx512vl(uVar7);
  auVar20 = vpblendd_avx2(auVar9,auVar20,0xc);
  uVar7 = vpmovd2m_avx512vl(auVar20);
  auVar13._0_8_ = 0;
  if ((~(ushort)uVar7 & 0xf) == 0) {
    fVar1 = (this->screenBounds).pMin.super_Tuple2<pbrt::Point2,_float>.y;
    fVar2 = (this->screenBounds).pMax.super_Tuple2<pbrt::Point2,_float>.y;
    auVar16 = ZEXT464((uint)fVar2);
    auVar20 = vinsertps_avx((undefined1  [16])BVar4,ZEXT416((uint)fVar1),0x10);
    _local_88 = vsubps_avx(auVar19,auVar20);
    auVar19 = vshufpd_avx((undefined1  [16])BVar4,(undefined1  [16])BVar4,1);
    if (BVar4.pMin.super_Tuple2<pbrt::Point2,_float>.x < auVar19._0_4_) {
      auVar5 = local_88._4_12_;
      local_88._0_4_ =
           local_88._0_4_ / (auVar19._0_4_ - BVar4.pMin.super_Tuple2<pbrt::Point2,_float>.x);
      register0x00001304 = auVar5;
    }
    if (fVar1 < fVar2) {
      auVar19 = vmovshdup_avx(_local_88);
      auVar16 = ZEXT1664(auVar19);
      auVar12._0_4_ = auVar19._0_4_ / (fVar2 - fVar1);
      auVar12._4_12_ = auVar19._4_12_;
      _local_88 = vinsertps_avx(_local_88,auVar12,0x10);
    }
    local_68 = vmovshdup_avx(_local_88);
    local_98.r = 0.0;
    local_98.g = 0.0;
    local_98.b = 0.0;
    c_00 = 0;
    local_70 = lambda;
    do {
      wl = (Vector3f *)
           (CONCAT44(SUB84(wl,4),
                     (int)(local_88._0_4_ *
                          (float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x)) |
           (ulong)(uint)(int)((float)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y *
                             (float)local_68._0_4_) << 0x20);
      FVar8 = Image::GetChannel(&this->image,(Point2i)wl,c_00,(WrapMode2D)0x200000002);
      auVar18 = auVar16._8_56_;
      pRVar6 = &local_98;
      if ((c_00 != 0) && (pRVar6 = (RGB *)&local_98.g, c_00 != 1)) {
        pRVar6 = (RGB *)&local_98.b;
      }
      pRVar6->r = FVar8;
      c_00 = c_00 + 1;
    } while (c_00 != 3);
    FVar8 = this->scale;
    local_88._4_4_ = FVar8;
    local_88._0_4_ = FVar8;
    fStack_80 = FVar8;
    fStack_7c = FVar8;
    auVar14 = ZEXT856(local_88._8_8_);
    RGBSpectrum::RGBSpectrum(&local_58,this->imageColorSpace,&local_98);
    SVar22 = RGBSpectrum::Sample(&local_58,local_70);
    auVar17._0_8_ = SVar22.values.values._8_8_;
    auVar17._8_56_ = auVar18;
    auVar16._0_8_ = SVar22.values.values._0_8_;
    auVar16._8_56_ = auVar14;
    auVar19 = vmovlhps_avx(auVar16._0_16_,auVar17._0_16_);
    auVar13._0_8_ =
         CONCAT44(auVar19._4_4_ * (float)local_88._4_4_,auVar19._0_4_ * (float)local_88._0_4_);
    auVar13._8_4_ = auVar19._8_4_ * fStack_80;
    auVar13._12_4_ = auVar19._12_4_ * fStack_7c;
    auVar19 = vshufpd_avx(auVar13,auVar13,1);
    uVar15 = auVar19._0_8_;
  }
  SVar22.values.values[2] = (float)(int)uVar15;
  SVar22.values.values[3] = (float)(int)((ulong)uVar15 >> 0x20);
  SVar22.values.values[0] = (float)(int)auVar13._0_8_;
  SVar22.values.values[1] = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
  return (SampledSpectrum)SVar22.values.values;
}

Assistant:

SampledSpectrum ProjectionLight::Projection(const Vector3f &wl,
                                            const SampledWavelengths &lambda) const {
    // Discard directions behind projection light
    if (wl.z < hither)
        return SampledSpectrum(0.);

    // Project point onto projection plane and compute RGB
    Point3f ps = ScreenFromLight(Point3f(wl.x, wl.y, wl.z));
    if (!Inside(Point2f(ps.x, ps.y), screenBounds))
        return SampledSpectrum(0.f);
    Point2f st = Point2f(screenBounds.Offset(Point2f(ps.x, ps.y)));
    RGB rgb;
    for (int c = 0; c < 3; ++c)
        rgb[c] = image.LookupNearestChannel(st, c);

    return scale * RGBSpectrum(*imageColorSpace, rgb).Sample(lambda);
}